

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_collection.cpp
# Opt level: O1

void __thiscall
duckdb::TupleDataCollection::InitializeScanChunk
          (TupleDataCollection *this,TupleDataScanState *state,DataChunk *chunk)

{
  int iVar1;
  reference pvVar2;
  const_reference __x;
  TupleDataAllocator *pTVar3;
  undefined4 extraout_var;
  size_type __n;
  vector<duckdb::LogicalType,_true> chunk_types;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::reserve
            (&local_48,
             (long)(state->chunk_state).column_ids.
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(state->chunk_state).column_ids.
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  if ((state->chunk_state).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (state->chunk_state).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pvVar2 = vector<unsigned_long,_true>::operator[](&(state->chunk_state).column_ids,__n);
      __x = vector<duckdb::LogicalType,_true>::operator[](&this->layout->types,*pvVar2);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&local_48,__x);
      __n = __n + 1;
    } while (__n < (ulong)((long)(state->chunk_state).column_ids.
                                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(state->chunk_state).column_ids.
                                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pTVar3 = shared_ptr<duckdb::TupleDataAllocator,_true>::operator->(&this->allocator);
  iVar1 = (*pTVar3->buffer_manager->_vptr_BufferManager[0x14])();
  DataChunk::Initialize
            (chunk,(Allocator *)CONCAT44(extraout_var,iVar1),
             (vector<duckdb::LogicalType,_true> *)&local_48,0x800);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
  return;
}

Assistant:

void TupleDataCollection::InitializeScanChunk(TupleDataScanState &state, DataChunk &chunk) const {
	auto &column_ids = state.chunk_state.column_ids;
	D_ASSERT(!column_ids.empty());
	vector<LogicalType> chunk_types;
	chunk_types.reserve(column_ids.size());
	for (idx_t i = 0; i < column_ids.size(); i++) {
		auto column_idx = column_ids[i];
		D_ASSERT(column_idx < layout.ColumnCount());
		chunk_types.push_back(layout.GetTypes()[column_idx]);
	}
	chunk.Initialize(allocator->GetAllocator(), chunk_types);
}